

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O2

int make_time(archive_write *a,uint8_t type,uint flg,int ti)

{
  void *pvVar1;
  long lVar2;
  byte bVar3;
  int iVar4;
  ssize_t sVar5;
  byte bVar6;
  long *plVar7;
  ulong uVar8;
  uint8_t b;
  uint8_t filetime [8];
  
  pvVar1 = a->format_data;
  uVar8 = (ulong)(uint)ti;
  lVar2 = *(long *)((long)pvVar1 + uVar8 * 8 + 0x40);
  if (lVar2 == *(long *)((long)pvVar1 + 0x18)) {
    iVar4 = enc_uint64(a,(ulong)type);
    if (iVar4 < 0) {
      return iVar4;
    }
    iVar4 = enc_uint64(a,*(long *)((long)pvVar1 + 0x18) * 8 + 2);
    if (iVar4 < 0) {
      return iVar4;
    }
    iVar4 = enc_uint64(a,1);
  }
  else {
    if (lVar2 == 0) {
      return 0;
    }
    iVar4 = enc_uint64(a,(ulong)type);
    if (iVar4 < 0) {
      return iVar4;
    }
    iVar4 = enc_uint64(a,(*(long *)((long)pvVar1 + 0x18) + 7U >> 3) +
                         *(long *)((long)pvVar1 + uVar8 * 8 + 0x40) * 8 + 2);
    if (iVar4 < 0) {
      return iVar4;
    }
    iVar4 = enc_uint64(a,0);
    if (iVar4 < 0) {
      return iVar4;
    }
    b = '\0';
    bVar3 = 0x80;
    bVar6 = 0;
    plVar7 = (long *)((long)pvVar1 + 0xf118);
    while (lVar2 = *plVar7, lVar2 != 0) {
      if ((*(uint *)(lVar2 + 0x38) & flg) != 0) {
        bVar6 = bVar6 | bVar3;
        b = bVar6;
      }
      if (bVar3 < 2) {
        sVar5 = compress_out(a,&b,1,ARCHIVE_Z_RUN);
        if ((int)sVar5 < 0) {
          return (int)sVar5;
        }
        b = '\0';
        bVar3 = 0x80;
        bVar6 = 0;
      }
      else {
        bVar3 = bVar3 >> 1;
      }
      plVar7 = (long *)(lVar2 + 0x18);
    }
    sVar5 = compress_out(a,&b,1,ARCHIVE_Z_RUN);
    iVar4 = (int)sVar5;
  }
  if (iVar4 < 0) {
    return iVar4;
  }
  iVar4 = enc_uint64(a,0);
  if (-1 < iVar4) {
    plVar7 = (long *)((long)pvVar1 + 0xf118);
    do {
      lVar2 = *plVar7;
      if (lVar2 == 0) {
        return 0;
      }
      if ((*(uint *)(lVar2 + 0x38) & flg) != 0) {
        filetime = (uint8_t  [8])
                   unix_to_ntfs(*(int64_t *)(lVar2 + 0x40 + uVar8 * 0x10),
                                *(uint32_t *)(lVar2 + 0x48 + uVar8 * 0x10));
        sVar5 = compress_out(a,filetime,8,ARCHIVE_Z_RUN);
        if ((int)sVar5 < 0) {
          return (int)sVar5;
        }
      }
      plVar7 = (long *)(lVar2 + 0x18);
    } while( true );
  }
  return iVar4;
}

Assistant:

static int
make_time(struct archive_write *a, uint8_t type, unsigned flg, int ti)
{
	uint8_t filetime[8];
	struct _7zip *zip = (struct _7zip *)a->format_data;
	struct file *file;
	int r;
	uint8_t b, mask;

	/*
	 * Make Time Bools.
	 */
	if (zip->total_number_time_defined[ti] == zip->total_number_entry) {
		/* Write Time Type. */
		r = enc_uint64(a, type);
		if (r < 0)
			return (r);
		/* Write EmptyStream Size. */
		r = enc_uint64(a, 2 + zip->total_number_entry * 8);
		if (r < 0)
			return (r);
		/* All are defined. */
		r = enc_uint64(a, 1);
		if (r < 0)
			return (r);
	} else {
		if (zip->total_number_time_defined[ti] == 0)
			return (ARCHIVE_OK);

		/* Write Time Type. */
		r = enc_uint64(a, type);
		if (r < 0)
			return (r);
		/* Write EmptyStream Size. */
		r = enc_uint64(a, 2 + ((zip->total_number_entry + 7) >> 3)
			+ zip->total_number_time_defined[ti] * 8);
		if (r < 0)
			return (r);

		/* All are not defined. */
		r = enc_uint64(a, 0);
		if (r < 0)
			return (r);

		b = 0;
		mask = 0x80;
		file = zip->file_list.first;
		for (;file != NULL; file = file->next) {
			if (file->flg & flg)
				b |= mask;
			mask >>= 1;
			if (mask == 0) {
				r = (int)compress_out(a, &b, 1, ARCHIVE_Z_RUN);
				if (r < 0)
					return (r);
				mask = 0x80;
				b = 0;
			}
		}
		if (mask != 0x80) {
			r = (int)compress_out(a, &b, 1, ARCHIVE_Z_RUN);
			if (r < 0)
				return (r);
		}
	}

	/* External. */
	r = enc_uint64(a, 0);
	if (r < 0)
		return (r);

	/*
	 * Make Times.
	 */
	file = zip->file_list.first;
	for (;file != NULL; file = file->next) {
		if ((file->flg & flg) == 0)
			continue;
		archive_le64enc(filetime, unix_to_ntfs(file->times[ti].time,
			file->times[ti].time_ns));
		r = (int)compress_out(a, filetime, 8, ARCHIVE_Z_RUN);
		if (r < 0)
			return (r);
	}

	return (ARCHIVE_OK);
}